

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal_impl.hpp
# Opt level: O2

Bound_slot_container * __thiscall
sig::
Signal_impl<void(int),sig::Optional_last_value<void>,int,std::less<int>,std::function<void(int)>,std::mutex>
::bind_args<int&>(Bound_slot_container *__return_storage_ptr__,
                 Signal_impl<void(int),sig::Optional_last_value<void>,int,std::less<int>,std::function<void(int)>,std::mutex>
                 *this,int *args)

{
  _Rb_tree_node_base *p_Var1;
  anon_class_16_2_93a8cea0 bind_slots;
  Bound_slot_container *local_40;
  int *local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_40 = __return_storage_ptr__;
  local_38 = args;
  std::mutex::lock((mutex *)&((pthread_mutex_t *)(this + 0xe0))->__data);
  const::{lambda(auto:1&)#1}::operator()
            ((_lambda_auto_1___1_ *)&local_40,
             (deque<std::shared_ptr<sig::Connection_impl<void_(int)>_>,_std::allocator<std::shared_ptr<sig::Connection_impl<void_(int)>_>_>_>
              *)(this + 8));
  for (p_Var1 = *(_Rb_tree_node_base **)(this + 0x70); p_Var1 != (_Rb_tree_node_base *)(this + 0x60)
      ; p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    const::{lambda(auto:1&)#1}::operator()
              ((_lambda_auto_1___1_ *)&local_40,
               (deque<std::shared_ptr<sig::Connection_impl<void_(int)>_>,_std::allocator<std::shared_ptr<sig::Connection_impl<void_(int)>_>_>_>
                *)&p_Var1[1]._M_parent);
  }
  const::{lambda(auto:1&)#1}::operator()
            ((_lambda_auto_1___1_ *)&local_40,
             (deque<std::shared_ptr<sig::Connection_impl<void_(int)>_>,_std::allocator<std::shared_ptr<sig::Connection_impl<void_(int)>_>_>_>
              *)(this + 0x88));
  pthread_mutex_unlock((pthread_mutex_t *)(this + 0xe0));
  return __return_storage_ptr__;
}

Assistant:

Bound_slot_container bind_args(Params&&... args) const {
        Bound_slot_container bound_slots;
        // Helper Function
        auto bind_slots = [&bound_slots, &args...](auto& conn_container) {
            for (auto& connection : conn_container) {
                if (connection->connected() && !connection->blocked() &&
                    !connection->get_slot().expired()) {
                    auto& slot = connection->get_slot();
                    bound_slots.push_back([slot, &args...] {
                        return slot(std::forward<Params>(args)...);
                    });
                }
            }
        };
        std::lock_guard<Mutex> lock{mtx_};
        // Bind arguments to all three types of connected Slots.
        bind_slots(connections_.front);
        for (auto& group : connections_.grouped) {
            bind_slots(group.second);
        }
        bind_slots(connections_.back);
        return bound_slots;
    }